

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderRequire(Fts3SegReader *pReader,char *pFrom,int nByte)

{
  int iVar1;
  
  iVar1 = 0;
  while( true ) {
    if (pReader->pBlob == (sqlite3_blob *)0x0) {
      return iVar1;
    }
    if (iVar1 != 0) break;
    if ((long)(pFrom + ((long)nByte - (long)pReader->aNode)) <= (long)pReader->nPopulate) {
      return 0;
    }
    iVar1 = fts3SegReaderIncrRead(pReader);
  }
  return iVar1;
}

Assistant:

static int fts3SegReaderRequire(Fts3SegReader *pReader, char *pFrom, int nByte){
  int rc = SQLITE_OK;
  assert( !pReader->pBlob
       || (pFrom>=pReader->aNode && pFrom<&pReader->aNode[pReader->nNode])
  );
  while( pReader->pBlob && rc==SQLITE_OK
     &&  (pFrom - pReader->aNode + nByte)>pReader->nPopulate
  ){
    rc = fts3SegReaderIncrRead(pReader);
  }
  return rc;
}